

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureCube_GL.cpp
# Opt level: O0

void __thiscall
Diligent::TextureCube_GL::CopyTexSubimage
          (TextureCube_GL *this,GLContextState *GLState,CopyTexSubimageAttribs *Attribs)

{
  GLint GVar1;
  GLint GVar2;
  GLint GVar3;
  Uint32 UVar4;
  Uint32 UVar5;
  GLenum GVar6;
  Uint32 UVar7;
  Uint32 UVar8;
  GLTextureObj *TexObj;
  Char *Message;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar9;
  undefined1 local_48 [8];
  string msg;
  GLenum err;
  GLenum CubeMapFaceBindTarget;
  CopyTexSubimageAttribs *Attribs_local;
  GLContextState *GLState_local;
  TextureCube_GL *this_local;
  
  uVar9 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  GVar6 = (this->super_TextureBaseGL).m_BindTarget;
  TexObj = TextureBaseGL::GetGLHandle(&this->super_TextureBaseGL);
  GLContextState::BindTexture(GLState,-1,GVar6,TexObj);
  GVar6 = GetCubeMapFaceBindTarget(Attribs->DstLayer);
  GVar1 = Attribs->DstMip;
  GVar2 = Attribs->DstX;
  GVar3 = Attribs->DstY;
  UVar4 = Attribs->SrcBox->MinX;
  UVar5 = Attribs->SrcBox->MinY;
  msg.field_2._12_4_ = GVar6;
  UVar7 = Box::Width(Attribs->SrcBox);
  UVar8 = Box::Height(Attribs->SrcBox);
  glCopyTexSubImage2D(GVar6,GVar1,GVar2,GVar3,UVar4,UVar5,CONCAT44(uVar9,UVar7),UVar8);
  msg.field_2._8_4_ = glGetError();
  if (msg.field_2._8_4_ != 0) {
    LogError<false,char[45],char[17],unsigned_int>
              (false,"CopyTexSubimage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
               ,0x137,(char (*) [45])"Failed to copy subimage data to texture cube",
               (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 8));
    FormatString<char[6]>((string *)local_48,(char (*) [6])0x4585f6);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"CopyTexSubimage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
               ,0x137);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void TextureCube_GL::CopyTexSubimage(GLContextState& GLState, const CopyTexSubimageAttribs& Attribs)
{
    GLState.BindTexture(-1, m_BindTarget, GetGLHandle());

    const GLenum CubeMapFaceBindTarget = GetCubeMapFaceBindTarget(Attribs.DstLayer);
    glCopyTexSubImage2D(CubeMapFaceBindTarget,
                        Attribs.DstMip,
                        Attribs.DstX,
                        Attribs.DstY,
                        Attribs.SrcBox.MinX,
                        Attribs.SrcBox.MinY,
                        Attribs.SrcBox.Width(),
                        Attribs.SrcBox.Height());
    DEV_CHECK_GL_ERROR("Failed to copy subimage data to texture cube");
}